

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O2

void __thiscall
Diligent::BufferBase<Diligent::EngineGLImplTraits>::CreateDefaultViews
          (BufferBase<Diligent::EngineGLImplTraits> *this)

{
  BIND_FLAGS BVar1;
  BufferViewImplType *pBVar2;
  anon_class_8_1_8991fb9c CreateDefaultView;
  
  BVar1 = (this->
          super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
          ).m_Desc.BindFlags;
  CreateDefaultView.this = this;
  if (((char)BVar1 < '\0') &&
     (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.Mode & ~BUFFER_MODE_FORMATTED) == BUFFER_MODE_STRUCTURED)) {
    pBVar2 = CreateDefaultViews::anon_class_8_1_8991fb9c::operator()
                       (&CreateDefaultView,BUFFER_VIEW_UNORDERED_ACCESS);
    std::
    __uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    ::reset((__uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             *)&this->m_pDefaultUAV,pBVar2);
    BVar1 = (this->
            super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            ).m_Desc.BindFlags;
  }
  if (((BVar1 & BIND_SHADER_RESOURCE) != BIND_NONE) &&
     (((this->
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       ).m_Desc.Mode & ~BUFFER_MODE_FORMATTED) == BUFFER_MODE_STRUCTURED)) {
    pBVar2 = CreateDefaultViews::anon_class_8_1_8991fb9c::operator()
                       (&CreateDefaultView,BUFFER_VIEW_SHADER_RESOURCE);
    std::
    __uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
    ::reset((__uniq_ptr_impl<Diligent::BufferViewGLImpl,_Diligent::STDDeleter<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>_>
             *)&this->m_pDefaultSRV,pBVar2);
  }
  return;
}

Assistant:

void CreateDefaultViews()
    {
        // Create default views for structured and raw buffers. For formatted buffers we do not know the view format, so
        // cannot create views.

        auto CreateDefaultView = [&](BUFFER_VIEW_TYPE ViewType) //
        {
            BufferViewDesc ViewDesc;
            ViewDesc.ViewType = ViewType;

            std::string ViewName;
            switch (ViewType)
            {
                case BUFFER_VIEW_UNORDERED_ACCESS:
                    ViewName = "Default UAV of buffer '";
                    break;

                case BUFFER_VIEW_SHADER_RESOURCE:
                    ViewName = "Default SRV of buffer '";
                    break;

                default:
                    UNEXPECTED("Unexpected buffer view type");
            }

            ViewName += this->m_Desc.Name;
            ViewName += '\'';
            ViewDesc.Name = ViewName.c_str();

            IBufferView* pView = nullptr;
            CreateViewInternal(ViewDesc, &pView, true);
            VERIFY(pView != nullptr, "Failed to create default view for buffer '", this->m_Desc.Name, "'");
            VERIFY(pView->GetDesc().ViewType == ViewType, "Unexpected view type");

            return static_cast<BufferViewImplType*>(pView);
        };

        if (this->m_Desc.BindFlags & BIND_UNORDERED_ACCESS && (this->m_Desc.Mode == BUFFER_MODE_STRUCTURED || this->m_Desc.Mode == BUFFER_MODE_RAW))
        {
            m_pDefaultUAV.reset(CreateDefaultView(BUFFER_VIEW_UNORDERED_ACCESS));
        }

        if (this->m_Desc.BindFlags & BIND_SHADER_RESOURCE && (this->m_Desc.Mode == BUFFER_MODE_STRUCTURED || this->m_Desc.Mode == BUFFER_MODE_RAW))
        {
            m_pDefaultSRV.reset(CreateDefaultView(BUFFER_VIEW_SHADER_RESOURCE));
        }
    }